

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

void anon_unknown.dwarf_5db41::compute_BRIO_order_recursive
               (index_t nb_vertices,double *vertices,index_t dimension,index_t stride,
               vector<unsigned_int> *sorted_indices,iterator b,iterator e,index_t threshold,
               double ratio,index_t *depth,vector<unsigned_int> *levels)

{
  long lVar1;
  index_t limit;
  iterator e_00;
  allocator local_c1;
  VertexMesh M;
  HilbertSort2d<(anonymous_namespace)::Hilbert_vcmp,_(anonymous_namespace)::VertexMesh> local_a8;
  string local_a0;
  HilbertSort3d<(anonymous_namespace)::Hilbert_vcmp,_(anonymous_namespace)::VertexMesh> local_80;
  
  limit = (index_t)sorted_indices;
  lVar1 = (long)e._M_current - (long)b._M_current >> 2;
  e_00._M_current = b._M_current;
  if (threshold < (uint)lVar1) {
    *depth = *depth + 1;
    e_00._M_current = b._M_current + (int)((double)lVar1 * ratio);
    compute_BRIO_order_recursive
              (nb_vertices,vertices,dimension,stride,sorted_indices,b,e_00,threshold,ratio,depth,
               levels);
  }
  M.vertices.base_ = vertices;
  M.vertices.stride_ = stride;
  M.vertices.nb_vertices_ = nb_vertices;
  if (dimension == 2) {
    HilbertSort2d<(anonymous_namespace)::Hilbert_vcmp,_(anonymous_namespace)::VertexMesh>::
    HilbertSort2d(&local_a8,&M,e_00,e,limit);
  }
  else {
    if (dimension != 3) {
      std::__cxx11::string::string
                ((string *)&local_a0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp"
                 ,&local_c1);
      GEO::geo_should_not_have_reached(&local_a0,0x23f4);
    }
    HilbertSort3d<(anonymous_namespace)::Hilbert_vcmp,_(anonymous_namespace)::VertexMesh>::
    HilbertSort3d(&local_80,&M,e_00,e,limit);
  }
  if (levels != (vector<unsigned_int> *)0x0) {
    local_a0._M_dataplus._M_p._0_4_ =
         (undefined4)
         ((ulong)((long)e._M_current -
                 (long)(sorted_indices->
                       super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                       ).
                       super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 2);
    std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>::
    emplace_back<unsigned_int>
              (&levels->
                super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>,
               (uint *)&local_a0);
  }
  return;
}

Assistant:

void compute_BRIO_order_recursive(
        index_t nb_vertices, const double* vertices,
        index_t dimension, index_t stride,
        vector<index_t>& sorted_indices,
        vector<index_t>::iterator b,
        vector<index_t>::iterator e,
        index_t threshold,
        double ratio,
        index_t& depth,
        vector<index_t>* levels
    ) {
        geo_debug_assert(e > b);

        vector<index_t>::iterator m = b;
        if(index_t(e - b) > threshold) {
            ++depth;
            m = b + int(double(e - b) * ratio);
            compute_BRIO_order_recursive(
                nb_vertices, vertices,
		dimension, stride,
                sorted_indices, b, m,
                threshold, ratio, depth,
                levels
            );
        }

        VertexMesh M(nb_vertices, vertices, stride);
	if(dimension == 3) {
	    HilbertSort3d<Hilbert_vcmp, VertexMesh>(
		M, m, e
	    );
	} else if(dimension ==2) {
	    HilbertSort2d<Hilbert_vcmp, VertexMesh>(
		M, m, e
	    );
	} else {
	    geo_assert_not_reached;
	}

        if(levels != nullptr) {
            levels->push_back(index_t(e - sorted_indices.begin()));
        }
    }